

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointSpline.cpp
# Opt level: O1

void __thiscall chrono::ChLinkPointSpline::UpdateTime(ChLinkPointSpline *this,double time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChLine *this_00;
  ChMarker *pCVar11;
  ChBodyFrame *pCVar12;
  element_type *peVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  double dVar19;
  char cVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  double dVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  double dVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  double dVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  double dVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  Vector vdir;
  Vector ptang;
  Vector vdir2;
  Vector ptang2;
  Vector vpoint;
  double mu;
  Coordsys newmarkpos;
  undefined1 local_1a8 [16];
  double local_118;
  double dStack_110;
  double local_108;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  ChVector<double> local_98;
  ulong local_78;
  undefined8 uStack_70;
  double local_60;
  Coordsys local_58;
  
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj.ChTime = time;
  this_00 = (this->trajectory_line).
            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (ChLine *)0x0) {
    return;
  }
  local_f8 = 0.0;
  dStack_f0 = 0.0;
  local_e8 = 0.0;
  local_a8 = 0.0;
  local_b8 = 0.0;
  dStack_b0 = 0.0;
  local_108 = 0.0;
  local_118 = 0.0;
  dStack_110 = 0.0;
  local_c8 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_98.m_data[2] = 0.0;
  local_98.m_data[0] = 0.0;
  local_98.m_data[1] = 0.0;
  pCVar11 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1;
  if (&(pCVar11->abs_frame).super_ChFrame<double>.coord != (ChCoordsys<double> *)&local_98) {
    local_98.m_data[0] = (pCVar11->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
    local_98.m_data[1] = (pCVar11->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
    local_98.m_data[2] = (pCVar11->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  }
  pCVar12 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2;
  local_98.m_data[0] =
       local_98.m_data[0] -
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  local_98.m_data[1] =
       local_98.m_data[1] -
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_98.m_data[2] =
       local_98.m_data[2] -
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_98.m_data[0];
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       local_98.m_data[1] *
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar29 = vfmadd231sd_fma(auVar75,auVar34,auVar29);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_98.m_data[2];
  auVar29 = vfmadd231sd_fma(auVar29,auVar65,auVar84);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       local_98.m_data[1] *
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar84 = vfmadd231sd_fma(auVar81,auVar34,auVar97);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar84 = vfmadd231sd_fma(auVar84,auVar65,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_98.m_data[0];
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_98.m_data[1] *
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar97 = vfmadd231sd_fma(auVar55,auVar35,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_98.m_data[2];
  auVar97 = vfmadd231sd_fma(auVar97,auVar66,auVar3);
  local_98.m_data[0] = auVar29._0_8_;
  local_98.m_data[1] = auVar84._0_8_;
  local_98.m_data[2] = auVar97._0_8_;
  geometry::ChLine::FindNearestLinePoint(this_00,&local_98,&local_60,0.0,this->tolerance);
  dVar31 = local_60;
  peVar13 = (this->trajectory_line).
            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar13->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar13,&local_f8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar31;
  auVar29 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar4);
  peVar13 = (this->trajectory_line).
            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar13->super_ChGeometry)._vptr_ChGeometry[0xc])(auVar29._0_8_,peVar13,&local_118);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_60 + 0.0001;
  auVar29 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar36);
  peVar13 = (this->trajectory_line).
            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar13->super_ChGeometry)._vptr_ChGeometry[0xb])(peVar13,&local_b8);
  peVar13 = (this->trajectory_line).
            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar13->super_ChGeometry)._vptr_ChGeometry[0xc])(auVar29._0_8_,peVar13,&local_d8);
  auVar25._0_8_ = local_108;
  dVar32 = dStack_110;
  dVar31 = local_118;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_118;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_108;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dStack_110 * dStack_110;
  auVar29 = vfmadd231sd_fma(auVar37,auVar56,auVar56);
  auVar29 = vfmadd231sd_fma(auVar29,auVar76,auVar76);
  if (auVar29._0_8_ < 0.0) {
    dVar30 = sqrt(auVar29._0_8_);
  }
  else {
    auVar29 = vsqrtsd_avx(auVar29,auVar29);
    dVar30 = auVar29._0_8_;
  }
  dVar19 = local_c8;
  dVar74 = dStack_d0;
  dVar33 = local_d8;
  bVar18 = 2.2250738585072014e-308 <= dVar30;
  dVar30 = 1.0 / dVar30;
  dStack_110 = (double)((ulong)bVar18 * (long)(dVar32 * dVar30));
  local_118 = (double)((ulong)bVar18 * (long)(dVar31 * dVar30) + (ulong)!bVar18 * 0x3ff0000000000000
                      );
  local_108 = (double)((ulong)bVar18 * (long)(auVar25._0_8_ * dVar30));
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_d8;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_c8;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dStack_d0 * dStack_d0;
  auVar29 = vfmadd231sd_fma(auVar38,auVar57,auVar57);
  auVar29 = vfmadd231sd_fma(auVar29,auVar77,auVar77);
  if (auVar29._0_8_ < 0.0) {
    dVar31 = sqrt(auVar29._0_8_);
  }
  else {
    auVar29 = vsqrtsd_avx(auVar29,auVar29);
    dVar31 = auVar29._0_8_;
  }
  bVar18 = 2.2250738585072014e-308 <= dVar31;
  dVar31 = 1.0 / dVar31;
  dStack_d0 = (double)((ulong)bVar18 * (long)(dVar74 * dVar31));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dStack_d0;
  auVar22._0_8_ =
       (double)((ulong)bVar18 * (long)(dVar33 * dVar31) + (ulong)!bVar18 * 0x3ff0000000000000);
  auVar22._8_8_ = 0;
  local_c8 = (double)((ulong)bVar18 * (long)(dVar19 * dVar31));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_c8;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_108;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_118;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dStack_110;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dStack_110 * local_c8;
  auVar84 = vfmsub231sd_fma(auVar95,auVar21,auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_108 * auVar22._0_8_;
  auVar29 = vfmsub231sd_fma(auVar59,auVar82,auVar23);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_118 * dStack_d0;
  auVar97 = vfmsub231sd_fma(auVar39,auVar88,auVar22);
  dVar31 = auVar29._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar31 * dVar31;
  auVar29 = vfmadd231sd_fma(auVar67,auVar84,auVar84);
  auVar68 = vfmadd231sd_fma(auVar29,auVar97,auVar97);
  local_d8 = auVar22._0_8_;
  if (auVar68._0_8_ < 0.0) {
    dVar32 = sqrt(auVar68._0_8_);
    auVar68._8_8_ = 0;
  }
  else {
    auVar29 = vsqrtsd_avx(auVar68,auVar68);
    dVar32 = auVar29._0_8_;
  }
  dVar100 = local_108;
  dVar19 = dStack_110;
  dVar74 = local_118;
  dVar33 = DAT_00b90b10;
  dVar30 = DAT_00b90b08;
  auVar25._0_8_ = VECT_Z;
  auVar101 = ZEXT816(0x3ff0000000000000);
  if (1e-07 <= dVar32) {
    if (auVar68._0_8_ < 0.0) {
      dVar32 = sqrt(auVar68._0_8_);
    }
    else {
      auVar29 = vsqrtsd_avx(auVar68,auVar68);
      dVar32 = auVar29._0_8_;
    }
    bVar18 = 2.2250738585072014e-308 <= dVar32;
    dVar32 = 1.0 / dVar32;
    dVar31 = (double)((ulong)bVar18 * (long)(dVar32 * dVar31));
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar31;
    auVar25._0_8_ =
         (double)((ulong)bVar18 * (long)(dVar32 * auVar84._0_8_) +
                 (ulong)!bVar18 * 0x3ff0000000000000);
    auVar25._8_8_ = 0;
    dVar32 = (double)((ulong)bVar18 * (long)(dVar32 * auVar97._0_8_));
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar32;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_118;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dStack_110;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_108;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = dVar31 * local_108;
    auVar84 = vfmsub231sd_fma(auVar90,auVar60,auVar26);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = dVar32 * local_118;
    auVar29 = vfmsub231sd_fma(auVar105,auVar25,auVar70);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = auVar25._0_8_ * dStack_110;
    auVar97 = vfmsub231sd_fma(auVar108,auVar41,auVar24);
    dVar30 = auVar29._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar30 * dVar30;
    auVar29 = vfmadd231sd_fma(auVar42,auVar84,auVar84);
    auVar29 = vfmadd231sd_fma(auVar29,auVar97,auVar97);
    if (auVar29._0_8_ < 0.0) {
      dVar33 = sqrt(auVar29._0_8_);
    }
    else {
      auVar29 = vsqrtsd_avx(auVar29,auVar29);
      dVar33 = auVar29._0_8_;
    }
    bVar18 = 2.2250738585072014e-308 <= dVar33;
    dVar33 = 1.0 / dVar33;
    dVar74 = (double)((ulong)bVar18 * (long)(dVar30 * dVar33));
    dVar30 = (double)((ulong)bVar18 * (long)(auVar84._0_8_ * dVar33) +
                     (ulong)!bVar18 * 0x3ff0000000000000);
    dVar33 = (double)((ulong)bVar18 * (long)(auVar97._0_8_ * dVar33));
    dVar100 = local_118;
    dVar87 = dVar30;
    local_1a8._0_8_ = dVar33;
    dVar19 = dVar74;
    dVar104 = local_108;
    dVar107 = dStack_110;
    goto LAB_005adba4;
  }
  auVar83._8_8_ = 0;
  auVar83._0_8_ = VECT_Z;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = DAT_00b90b08;
  auVar78._0_8_ = -VECT_Z;
  auVar78._8_8_ = 0x8000000000000000;
  auVar89._0_8_ = -DAT_00b90b08;
  auVar89._8_8_ = 0x8000000000000000;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = DAT_00b90b10;
  local_78 = 0x8000000000000000;
  uStack_70 = 0x8000000000000000;
  auVar110._0_8_ = -DAT_00b90b10;
  auVar110._8_8_ = 0x8000000000000000;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_118;
  auVar28 = ZEXT816(0) << 0x40;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = local_108;
  if ((((local_118 != 0.0) || (NAN(local_118))) || (dStack_110 != 0.0)) || (NAN(dStack_110))) {
LAB_005ad75d:
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dStack_110 * dStack_110;
    auVar29 = vfmadd231sd_fma(auVar40,auVar69,auVar69);
    auVar29 = vfmadd231sd_fma(auVar29,auVar119,auVar119);
    if (auVar29._0_8_ < 0.0) {
      dVar31 = sqrt(auVar29._0_8_);
    }
    else {
      auVar29 = vsqrtsd_avx(auVar29,auVar29);
      dVar31 = auVar29._0_8_;
    }
    bVar18 = 2.2250738585072014e-308 <= dVar31;
    dVar31 = 1.0 / dVar31;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = (ulong)bVar18 * (long)(dVar19 * dVar31);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = (ulong)bVar18 * (long)(dVar74 * dVar31) + (ulong)!bVar18 * 0x3ff0000000000000;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (ulong)bVar18 * (long)(dVar100 * dVar31);
  }
  else {
    auVar27 = ZEXT816(0) << 0x40;
    if ((local_108 != 0.0) || (NAN(local_108))) goto LAB_005ad75d;
  }
  dVar104 = auVar28._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar104 * dVar30;
  auVar29 = vfmadd213sd_fma(auVar110,auVar27,auVar43);
  dVar30 = auVar29._0_8_;
  dVar100 = auVar101._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar33 * dVar100;
  auVar84 = vfmadd213sd_fma(auVar78,auVar28,auVar44);
  dVar107 = auVar27._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar107 * auVar25._0_8_;
  auVar97 = vfmadd213sd_fma(auVar89,auVar101,auVar45);
  dVar33 = auVar97._0_8_;
  dVar74 = auVar84._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar74 * dVar74;
  auVar29 = vfmadd231sd_fma(auVar46,auVar29,auVar29);
  auVar29 = vfmadd231sd_fma(auVar29,auVar97,auVar97);
  if (auVar29._0_8_ < 0.0) {
    dVar31 = sqrt(auVar29._0_8_);
  }
  else {
    auVar29 = vsqrtsd_avx(auVar29,auVar29);
    dVar31 = auVar29._0_8_;
  }
  if (dVar31 < 0.0001) {
    auVar15._8_8_ = 0x7fffffffffffffff;
    auVar15._0_8_ = 0x7fffffffffffffff;
    auVar29 = vandpd_avx512vl(auVar83,auVar15);
    if (0.9 <= auVar29._0_8_) {
      auVar16._8_8_ = 0x7fffffffffffffff;
      auVar16._0_8_ = 0x7fffffffffffffff;
      auVar29 = vandpd_avx512vl(auVar96,auVar16);
      if (0.9 <= auVar29._0_8_) {
        auVar17._8_8_ = 0x7fffffffffffffff;
        auVar17._0_8_ = 0x7fffffffffffffff;
        auVar29 = vandpd_avx512vl(auVar114,auVar17);
        auVar84 = SUB6416(ZEXT864(0),0) << 0x40;
        if (0.9 <= auVar29._0_8_) goto LAB_005adadc;
        auVar29 = ZEXT816(0x3ff0000000000000);
      }
      else {
        auVar84 = ZEXT816(0x3ff0000000000000);
LAB_005adadc:
        auVar29 = ZEXT816(0);
      }
      auVar97 = ZEXT816(0) << 0x40;
    }
    else {
      auVar97 = ZEXT816(0x3ff0000000000000);
      auVar29 = ZEXT816(0);
      auVar84 = SUB6416(ZEXT864(0),0) << 0x40;
    }
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auVar84._0_8_ * (double)((ulong)dVar104 ^ local_78);
    auVar1 = vfmadd231sd_fma(auVar111,auVar27,auVar29);
    dVar30 = auVar1._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auVar29._0_8_ * (double)((ulong)dVar100 ^ local_78);
    auVar29 = vfmadd231sd_fma(auVar79,auVar28,auVar97);
    dVar74 = auVar29._0_8_;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = auVar97._0_8_ * (double)((ulong)dVar107 ^ local_78);
    auVar29 = vfmadd231sd_fma(auVar91,auVar101,auVar84);
    dVar33 = auVar29._0_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar74 * dVar74;
    auVar84 = vfmadd231sd_fma(auVar47,auVar1,auVar1);
    auVar29 = vfmadd231sd_fma(auVar84,auVar29,auVar29);
    if (auVar29._0_8_ < 0.0) {
      dVar31 = sqrt(auVar29._0_8_);
    }
    else {
      auVar29 = vsqrtsd_avx(auVar29,auVar29);
      dVar31 = auVar29._0_8_;
    }
  }
  dVar31 = 1.0 / dVar31;
  dVar30 = dVar30 * dVar31;
  dVar74 = dVar74 * dVar31;
  dVar33 = dVar33 * dVar31;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar107 * dVar33;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = dVar74;
  auVar29 = vfmsub231sd_fma(auVar98,auVar117,auVar28);
  auVar25._0_8_ = auVar29._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar33;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dVar104 * dVar30;
  auVar29 = vfmsub231sd_fma(auVar120,auVar48,auVar101);
  dVar31 = auVar29._0_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar74 * dVar100;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar30;
  auVar29 = vfmsub231sd_fma(auVar112,auVar115,auVar27);
  dVar32 = auVar29._0_8_;
  dVar87 = 0.0;
  local_1a8._0_8_ = 0.0;
  dVar19 = 0.0;
LAB_005adba4:
  dVar14 = dVar33 + dVar31 + dVar100;
  local_1a8._8_8_ = 0;
  if (0.0 <= dVar14) {
    dVar14 = dVar14 + 1.0;
    if (dVar14 < 0.0) {
      dVar31 = sqrt(dVar14);
    }
    else {
      auVar49._8_8_ = 0;
      auVar49._0_8_ = dVar14;
      auVar29 = vsqrtsd_avx(auVar49,auVar49);
      dVar31 = auVar29._0_8_;
    }
    dVar33 = dVar31 * 0.5;
    dVar31 = 0.5 / dVar31;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = (dVar32 - dVar74) * dVar31;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = (dVar30 - dVar104) * dVar31;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = (dVar107 - auVar25._0_8_) * dVar31;
  }
  else {
    cVar20 = dVar100 < dVar31;
    dVar14 = dVar100;
    if ((bool)cVar20) {
      dVar14 = dVar31;
    }
    if (dVar14 < dVar33) {
      cVar20 = '\x02';
    }
    if (cVar20 == '\x02') {
      dVar31 = ((dVar33 - dVar100) - dVar31) + 1.0;
      if (dVar31 < 0.0) {
        dVar33 = sqrt(dVar31);
      }
      else {
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar31;
        auVar29 = vsqrtsd_avx(auVar51,auVar51);
        dVar33 = auVar29._0_8_;
      }
      auVar80._8_8_ = 0;
      auVar80._0_8_ = dVar33 * 0.5;
      dVar33 = 0.5 / dVar33;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = (dVar104 + dVar30) * dVar33;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = (dVar32 + dVar74) * dVar33;
      dVar30 = dVar107 - auVar25._0_8_;
    }
    else if (cVar20 == '\x01') {
      dVar31 = ((dVar31 - dVar33) - dVar100) + 1.0;
      if (dVar31 < 0.0) {
        dVar33 = sqrt(dVar31);
      }
      else {
        auVar50._8_8_ = 0;
        auVar50._0_8_ = dVar31;
        auVar29 = vsqrtsd_avx(auVar50,auVar50);
        dVar33 = auVar29._0_8_;
      }
      auVar71._8_8_ = 0;
      auVar71._0_8_ = dVar33 * 0.5;
      dVar33 = 0.5 / dVar33;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = (dVar32 + dVar74) * dVar33;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = (dVar107 + auVar25._0_8_) * dVar33;
      dVar30 = dVar30 - dVar104;
    }
    else {
      dVar31 = ((dVar100 - dVar31) - dVar33) + 1.0;
      if (dVar31 < 0.0) {
        dVar33 = sqrt(dVar31);
      }
      else {
        auVar52._8_8_ = 0;
        auVar52._0_8_ = dVar31;
        auVar29 = vsqrtsd_avx(auVar52,auVar52);
        dVar33 = auVar29._0_8_;
      }
      auVar61._8_8_ = 0;
      auVar61._0_8_ = dVar33 * 0.5;
      dVar33 = 0.5 / dVar33;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = (dVar107 + auVar25._0_8_) * dVar33;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = (dVar104 + dVar30) * dVar33;
      dVar30 = dVar32 - dVar74;
    }
    dVar33 = dVar30 * dVar33;
  }
  pCVar12 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_f8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       dStack_f0 *
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar29 = vfmadd231sd_fma(auVar99,auVar53,auVar5);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_e8;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar29 = vfmadd231sd_fma(auVar29,auVar102,auVar6);
  local_f8 = auVar29._0_8_ +
             (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       dStack_f0 *
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar29 = vfmadd231sd_fma(auVar106,auVar53,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar29 = vfmadd231sd_fma(auVar29,auVar102,auVar8);
  local_58.pos.m_data[1] =
       auVar29._0_8_ +
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       dStack_f0 *
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar29 = vfmadd231sd_fma(auVar92,auVar53,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar29 = vfmadd231sd_fma(auVar29,auVar102,auVar10);
  local_e8 = auVar29._0_8_ +
             (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar93._8_8_ = 0;
  auVar93._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar31 = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar31;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar33;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = auVar61._0_8_ * dVar31;
  auVar29 = vfmsub231sd_fma(auVar109,auVar93,auVar85);
  dVar32 = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar32;
  auVar29 = vfnmadd231sd_fma(auVar29,auVar113,auVar71);
  auVar25._0_8_ = (pCVar12->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar116._8_8_ = 0;
  auVar116._0_8_ = auVar25._0_8_;
  auVar97 = vfnmadd231sd_fma(auVar29,auVar116,auVar80);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar33 * dVar31;
  auVar29 = vfmadd231sd_fma(auVar118,auVar93,auVar61);
  auVar29 = vfnmadd231sd_fma(auVar29,auVar116,auVar71);
  auVar29 = vfmadd231sd_fma(auVar29,auVar113,auVar80);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar32 * dVar33;
  auVar84 = vfmadd231sd_fma(auVar121,auVar93,auVar71);
  auVar84 = vfmadd231sd_fma(auVar84,auVar116,auVar61);
  auVar1 = vfnmadd231sd_fma(auVar84,auVar103,auVar80);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar25._0_8_ * dVar33;
  auVar84 = vfmadd231sd_fma(auVar86,auVar93,auVar80);
  auVar84 = vfnmadd231sd_fma(auVar84,auVar113,auVar61);
  auVar84 = vfmadd231sd_fma(auVar84,auVar103,auVar71);
  local_58.rot.m_data[0] = auVar97._0_8_;
  local_58.rot.m_data[1] = auVar29._0_8_;
  local_58.rot.m_data[2] = auVar1._0_8_;
  local_58.rot.m_data[3] = auVar84._0_8_;
  dStack_f0 = local_58.pos.m_data[1];
  local_58.pos.m_data[0] = local_f8;
  local_58.pos.m_data[2] = local_e8;
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,&local_58);
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->motion_type =
       M_MOTION_EXTERNAL;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = (dStack_f0 - dStack_b0) * (dStack_f0 - dStack_b0);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_f8 - local_b8;
  auVar29 = vfmadd231sd_fma(auVar54,auVar72,auVar72);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_e8 - local_a8;
  auVar29 = vfmadd231sd_fma(auVar29,auVar62,auVar62);
  if (auVar29._0_8_ < 0.0) {
    dVar31 = sqrt(auVar29._0_8_);
  }
  else {
    auVar29 = vsqrtsd_avx(auVar29,auVar29);
    dVar31 = auVar29._0_8_;
  }
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar87;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_b8 - local_f8;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar19 * (dStack_b0 - dStack_f0);
  auVar29 = vfmadd213sd_fma(auVar94,auVar63,auVar73);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_a8 - local_e8;
  auVar29 = vfmadd213sd_fma(local_1a8,auVar64,auVar29);
  if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2850)) {
    (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2818)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_00b90ac8;
  }
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = 0.0;
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = 0.0;
  dVar32 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data[0];
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] =
       (dVar32 * dVar32) / ((dVar31 * dVar31) / (auVar29._0_8_ + auVar29._0_8_));
  if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x26f0)) {
    (this->super_ChLinkLockLock).deltaC.rot.m_data[0] = QUNIT;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[1] = DAT_00b90978;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[2] = DAT_00b90980;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[3] = DAT_00b90988;
  }
  if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2698)) {
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[1] = DAT_00b90958;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[2] = DAT_00b90960;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[3] = DAT_00b90968;
  }
  if (this != (ChLinkPointSpline *)(sBulletDNAstr64 + 0x2660)) {
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[1] = DAT_00b90958;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[2] = DAT_00b90960;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[3] = DAT_00b90968;
  }
  return;
}

Assistant:

void ChLinkPointSpline::UpdateTime(double time) {
    ChTime = time;

    if (trajectory_line) {
        Vector param, ptang, ptang2, vdir, vdir2, vnorm, vrad, vpoint;
        double mu, ds, dh, mrad;

        // find nearest point
        vpoint = marker1->GetAbsCoord().pos;
        vpoint = Body2->TransformPointParentToLocal(vpoint);
        trajectory_line->FindNearestLinePoint(vpoint, mu, 0, tolerance);

        param.y() = 0;
        param.z() = 0;
        param.x() = mu;
        trajectory_line->Evaluate(ptang, param.x());

        if (param.x() < 0)
            param.x() = 0;
        trajectory_line->Derive(vdir, param.x());

        param.x() = mu + BDF_STEP_HIGH;
        if (param.x() > 1)
            param.x() = 1;
        trajectory_line->Evaluate(ptang2, param.x());

        trajectory_line->Derive(vdir2, param.x());

        ChMatrix33<> ma;

        vdir = Vnorm(vdir);
        vdir2 = Vnorm(vdir2);
        vnorm = Vcross(vdir2, vdir);
        if (vnorm.Length() < 1e-7) {
            // on a straight segment, no curvature, so define normal and radial by these:
            ma.Set_A_Xdir(vdir, -VECT_Z);
        } else {
            vnorm.Normalize();
            vrad = Vnorm(Vcross(vdir, vnorm));
            ma.Set_A_axis(vdir, vnorm, vrad);
        }
        Quaternion qabsdir = ma.Get_A_quaternion();

        ptang = Body2->TransformPointLocalToParent(ptang);
        qabsdir = Body2->GetRot() * qabsdir;

        Coordsys newmarkpos;
        newmarkpos.pos = ptang;
        newmarkpos.rot = qabsdir;
        marker2->Impose_Abs_Coord(newmarkpos);  // move "main" marker2 into tangent position
        marker2->SetMotionType(
            ChMarker::M_MOTION_EXTERNAL);  // the BDF routine won't handle speed and acc.calculus of the moved marker!

        ds = Vlength(Vsub(ptang, ptang2));
        dh = Vdot(Vsub(ptang2, ptang), vrad);
        mrad = ((ds * ds) / (2 * dh));  // radius of curvature on spline

        ChMatrix33<> mw;
        mw.Set_A_quaternion(marker2->GetAbsCoord().rot);

        deltaC.pos = VNULL;
        deltaC_dt.pos = VNULL;
        deltaC_dtdt.pos.x() = 0;  // csys X axis aligned to vdir: just
        deltaC_dtdt.pos.y() = 0;  // impose centripetal acceleration
        // deltaC_dtdt.pos.z() =   pow(Vdot(this->GetRelM_dt().pos, vdir), 2) / mrad;
        deltaC_dtdt.pos.z() = pow(GetRelM_dt().pos.x(), 2) / mrad;

        deltaC.rot = QUNIT;
        deltaC_dt.rot = QNULL;
        deltaC_dtdt.rot = QNULL;
    }
}